

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Cpu.cpp
# Opt level: O0

void __thiscall Nes_Cpu::reset(Nes_Cpu *this,void *unmapped_page)

{
  void *in_RSI;
  Nes_Cpu *in_RDI;
  void *unaff_retaddr;
  bool mirror;
  
  in_RDI->state = &in_RDI->state_;
  (in_RDI->r).status = '\x04';
  (in_RDI->r).sp = 0xff;
  (in_RDI->r).pc = 0;
  (in_RDI->r).a = '\0';
  (in_RDI->r).x = '\0';
  (in_RDI->r).y = '\0';
  (in_RDI->state_).time = 0;
  (in_RDI->state_).base = 0;
  in_RDI->irq_time_ = 0x40000000;
  in_RDI->end_time_ = 0x40000000;
  in_RDI->error_count_ = 0;
  set_code_page(in_RDI,0x20,in_RSI);
  mirror = SUB81((ulong)in_RDI >> 0x38,0);
  map_code(this,unmapped_page._4_4_,(uint)unmapped_page,unaff_retaddr,mirror);
  map_code(this,unmapped_page._4_4_,(uint)unmapped_page,unaff_retaddr,mirror);
  blargg_verify_byte_order();
  return;
}

Assistant:

void Nes_Cpu::reset( void const* unmapped_page )
{
	check( state == &state_ );
	state = &state_;
	r.status = st_i;
	r.sp = 0xFF;
	r.pc = 0;
	r.a  = 0;
	r.x  = 0;
	r.y  = 0;
	state_.time = 0;
	state_.base = 0;
	irq_time_ = future_nes_time;
	end_time_ = future_nes_time;
	error_count_ = 0;
	
	assert( page_size == 0x800 ); // assumes this
	set_code_page( page_count, unmapped_page );
	map_code( 0x2000, 0xE000, unmapped_page, true );
	map_code( 0x0000, 0x2000, low_mem, true );
	
	blargg_verify_byte_order();
}